

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_weierstrass_is_identity(void)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *wp;
  size_t sVar1;
  WeierstrassPoint *src;
  size_t i;
  ulong index;
  
  wc = wcurve();
  wp = ecc_weierstrass_point_new_identity(wc);
  index = 1;
  while( true ) {
    sVar1 = (*looplimit)(5);
    if (sVar1 <= index) break;
    src = wpoint(wc,index);
    ecc_weierstrass_point_copy_into(wp,src);
    ecc_weierstrass_point_free(src);
    log_start();
    ecc_weierstrass_is_identity(wp);
    log_end();
    index = index + 1;
  }
  ecc_weierstrass_point_free(wp);
  ecc_weierstrass_curve_free(wc);
  return;
}

Assistant:

static void test_ecc_weierstrass_is_identity(void)
{
    WeierstrassCurve *wc = wcurve();
    WeierstrassPoint *a = ecc_weierstrass_point_new_identity(wc);
    for (size_t i = 1; i < looplimit(5); i++) {
        WeierstrassPoint *A = wpoint(wc, i);
        ecc_weierstrass_point_copy_into(a, A);
        ecc_weierstrass_point_free(A);

        log_start();
        ecc_weierstrass_is_identity(a);
        log_end();
    }
    ecc_weierstrass_point_free(a);
    ecc_weierstrass_curve_free(wc);
}